

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O2

void __thiscall
FPCXTexture::ReadPCX4bits(FPCXTexture *this,BYTE *dst,FileReader *lump,PCXHeader *hdr)

{
  ushort uVar1;
  void *pvVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  BYTE *__s;
  int iVar8;
  byte bVar9;
  int iVar10;
  
  pvVar2 = operator_new__((ulong)hdr->bytesPerScanLine);
  uVar7 = lump->Length - 0x80;
  pbVar3 = (byte *)operator_new__(uVar7);
  (*(lump->super_FileReaderBase)._vptr_FileReaderBase[2])(lump,pbVar3,uVar7);
  bVar9 = 0;
  iVar10 = 0;
  pbVar5 = pbVar3;
  for (uVar6 = 0; uVar6 < (this->super_FTexture).Height; uVar6 = uVar6 + 1) {
    uVar1 = (this->super_FTexture).Width;
    __s = dst + uVar6 * uVar1;
    memset(__s,0,(ulong)uVar1);
    for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
      uVar1 = hdr->bytesPerScanLine;
      for (lVar4 = 0; (uint)uVar1 != (uint)lVar4; lVar4 = lVar4 + 1) {
        if (iVar10 == 0) {
          bVar9 = *pbVar5;
          if (bVar9 < 0xc0) {
            pbVar5 = pbVar5 + 1;
            iVar10 = 1;
          }
          else {
            iVar10 = bVar9 - 0xc0;
            bVar9 = pbVar5[1];
            pbVar5 = pbVar5 + 2;
          }
        }
        iVar10 = iVar10 + -1;
        *(byte *)((long)pvVar2 + lVar4) = bVar9;
      }
      for (uVar7 = 0; uVar7 < (this->super_FTexture).Width; uVar7 = uVar7 + 1) {
        if ((char)(*(char *)((long)pvVar2 + (uVar7 >> 3)) << ((byte)uVar7 & 7)) < '\0') {
          __s[uVar7] = __s[uVar7] + (char)(1 << ((byte)iVar8 & 0x1f));
        }
      }
    }
  }
  operator_delete__(pvVar2);
  operator_delete__(pbVar3);
  return;
}

Assistant:

void FPCXTexture::ReadPCX4bits (BYTE *dst, FileReader & lump, PCXHeader *hdr)
{
	int rle_count = 0, rle_value = 0;
	int x, y, c;
	int bytes;
	BYTE * line = new BYTE[hdr->bytesPerScanLine];
	BYTE * colorIndex = new BYTE[Width];

	BYTE * srcp = new BYTE[lump.GetLength() - sizeof(PCXHeader)];
	lump.Read(srcp, lump.GetLength() - sizeof(PCXHeader));
	BYTE * src = srcp;

	for (y = 0; y < Height; ++y)
	{
		BYTE * ptr = &dst[y * Width];
		memset (ptr, 0, Width * sizeof (BYTE));

		for (c = 0; c < 4; ++c)
		{
			BYTE * pLine = line;

			bytes = hdr->bytesPerScanLine;

			while (bytes--)
			{
				if (rle_count == 0)
				{
					if ( (rle_value = *src++) < 0xc0)
					{
						rle_count = 1;
					}
					else
					{
						rle_count = rle_value - 0xc0;
						rle_value = *src++;
					}
				}

				rle_count--;
				*(pLine++) = rle_value;
			}

			/* compute line's color indexes */
			for (x = 0; x < Width; ++x)
			{
				if (line[x / 8] & (128 >> (x % 8)))
					ptr[x] += (1 << c);
			}
		}
	}

	/* release memory */
	delete [] colorIndex;
	delete [] line;
	delete [] srcp;
}